

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O1

void prune_intra_mode_with_hog
               (MACROBLOCK *x,BLOCK_SIZE bsize,BLOCK_SIZE sb_size,float th,
               uint8_t *directional_mode_skip_mask,int is_chroma)

{
  ushort *puVar1;
  long lVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  float *pfVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ushort *puVar18;
  int iVar19;
  uint uVar20;
  undefined7 in_register_00000031;
  ulong uVar21;
  _Bool *p_Var22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int *piVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float scores [8];
  undefined1 local_d8 [4];
  float afStack_d4 [3];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58 [10];
  int iVar29;
  
  bVar36 = is_chroma != 0;
  local_68 = ZEXT816(0);
  local_78 = local_68;
  local_88 = local_68;
  local_98 = local_68;
  local_a8 = local_68;
  local_b8 = local_68;
  local_c8 = local_68;
  _local_d8 = local_68;
  iVar5 = (x->e_mbd).plane[bVar36].subsampling_x;
  iVar6 = (x->e_mbd).plane[bVar36].subsampling_y;
  uVar23 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  iVar31 = (x->e_mbd).mb_to_right_edge;
  iVar32 = (x->e_mbd).mb_to_bottom_edge;
  iVar32 = (int)((iVar32 >> 0x1f & iVar32 >> 3) + (uint)block_size_high[uVar23]) >>
           ((byte)iVar6 & 0x1f);
  iVar31 = (int)((iVar31 >> 0x1f & iVar31 >> 3) + (uint)block_size_wide[uVar23]) >>
           ((byte)iVar5 & 0x1f);
  if (x->is_sb_gradient_cached[bVar36] == true) {
    bVar36 = is_chroma != 0;
    bVar3 = (byte)(x->e_mbd).plane[bVar36].subsampling_x;
    bVar9 = block_size_wide[sb_size] >> (bVar3 & 0x1f);
    if (iVar32 < 3) {
      fVar39 = 0.1;
    }
    else {
      p_Var22 = &x->pixel_gradient_info
                 [(ulong)bVar9 +
                  (long)(int)((("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [sb_size] - 1 & (x->e_mbd).mi_col) << (2 - bVar3 & 0x1f)) +
                             (("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [sb_size] - 1 & (x->e_mbd).mi_row) <<
                             (2U - (char)(x->e_mbd).plane[bVar36].subsampling_y & 0x1f)) *
                             (uint)bVar9) + (ulong)bVar36 * 0x4000 + 1].is_dx_zero;
      fVar39 = 0.1;
      uVar23 = 1;
      do {
        if (2 < iVar31) {
          lVar24 = 0;
          do {
            uVar4 = *(ushort *)(p_Var22 + lVar24 * 4 + -3);
            if (uVar4 != 0) {
              if (p_Var22[lVar24 * 4] == true) {
                local_d8 = (undefined1  [4])((float)local_d8 + (float)(uVar4 >> 1));
                pfVar13 = (float *)(local_68 + 0xc);
                fVar38 = (float)(uVar4 >> 1);
              }
              else {
                pfVar13 = (float *)(local_d8 + (long)p_Var22[lVar24 * 4 + -1] * 4);
                fVar38 = (float)uVar4;
              }
              fVar39 = fVar39 + (float)uVar4;
              *pfVar13 = fVar38 + *pfVar13;
            }
            lVar24 = lVar24 + 1;
          } while ((ulong)(iVar31 - 1) - 1 != lVar24);
        }
        uVar23 = uVar23 + 1;
        p_Var22 = p_Var22 + (ulong)bVar9 * 4;
      } while (uVar23 != iVar32 - 1);
    }
    lVar24 = 0;
    do {
      auVar7._4_4_ = fVar39;
      auVar7._0_4_ = fVar39;
      auVar7._8_4_ = fVar39;
      auVar7._12_4_ = fVar39;
      auVar37 = divps(*(undefined1 (*) [16])(local_d8 + lVar24 * 4),auVar7);
      *(undefined1 (*) [16])(local_d8 + lVar24 * 4) = auVar37;
      lVar24 = lVar24 + 4;
    } while (lVar24 != 0x20);
  }
  else {
    uVar23 = (ulong)((uint)bVar36 * 0x80 + (uint)bVar36 * 8);
    lVar24 = *(long *)((long)&x->plane[0].src.buf + uVar23);
    lVar14 = (long)*(int *)((long)&x->plane[0].src.stride + uVar23);
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      if (iVar32 < 3) {
        fVar39 = 0.1;
      }
      else {
        fVar39 = 0.1;
        iVar33 = 1;
        do {
          lVar2 = lVar24 + lVar14;
          if (2 < iVar31) {
            lVar25 = lVar24 + lVar14 + -1;
            lVar26 = lVar14 + lVar2;
            uVar23 = 1;
            do {
              lVar30 = lVar25 + uVar23;
              lVar17 = uVar23 + lVar2 + 1;
              iVar15 = (uint)*(byte *)(lVar14 + lVar17) +
                       (uint)*(byte *)(-lVar14 + lVar17) + (uint)*(byte *)(lVar2 + 1 + uVar23) * 2;
              iVar34 = (uint)*(byte *)(lVar14 + lVar30) +
                       (uint)*(byte *)(-lVar14 + lVar30) + (uint)*(byte *)(lVar25 + uVar23) * 2;
              iVar12 = (uint)*(byte *)(lVar26 + 1 + uVar23) +
                       (uint)*(byte *)(lVar26 + -1 + uVar23) + (uint)*(byte *)(lVar26 + uVar23) * 2;
              iVar27 = (uint)*(byte *)(lVar24 + 1 + uVar23) +
                       (uint)*(byte *)(lVar24 + -1 + uVar23) + (uint)*(byte *)(lVar24 + uVar23) * 2;
              iVar19 = iVar15 - iVar34;
              if ((iVar19 != 0) || (iVar12 != iVar27)) {
                iVar12 = iVar12 - iVar27;
                iVar27 = -iVar19;
                if (0 < iVar19) {
                  iVar27 = iVar19;
                }
                iVar29 = -iVar12;
                if (0 < iVar12) {
                  iVar29 = iVar12;
                }
                uVar28 = iVar29 + iVar27;
                if (uVar28 != 0) {
                  if (iVar15 == iVar34) {
                    local_d8 = (undefined1  [4])((float)local_d8 + (float)(uVar28 >> 1));
                    pfVar13 = (float *)(local_68 + 0xc);
                    fVar38 = (float)(uVar28 >> 1);
                  }
                  else {
                    iVar19 = (iVar12 * 0x10000) / iVar19;
                    if (iVar19 < -0x11a6e) {
                      uVar16 = 7;
                      uVar20 = 0;
                    }
                    else if (iVar19 < -0xc79) {
                      uVar16 = 0xf;
                      uVar20 = 8;
                    }
                    else {
                      uVar20 = (uint)(0xe821 < iVar19) * 8 + 0x10;
                      uVar16 = (uint)(0xe821 < iVar19) * 8 + 0x17;
                    }
                    lVar30 = 0x7c;
                    if (uVar20 <= uVar16) {
                      uVar21 = (ulong)uVar20;
                      piVar35 = &get_hist_bin_idx_thresholds + uVar21;
                      do {
                        if (iVar19 <= *piVar35) goto LAB_0024c3e8;
                        uVar21 = uVar21 + 1;
                        piVar35 = piVar35 + 1;
                      } while (uVar16 + 1 != uVar21);
                      uVar21 = 0x1f;
LAB_0024c3e8:
                      lVar30 = (long)(int)uVar21 << 2;
                    }
                    pfVar13 = (float *)(local_d8 + lVar30);
                    fVar38 = (float)(int)uVar28;
                  }
                  fVar39 = fVar39 + (float)(int)uVar28;
                  *pfVar13 = fVar38 + *pfVar13;
                }
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != iVar31 - 1);
          }
          bVar36 = iVar33 != iVar32 + -2;
          lVar24 = lVar2;
          iVar33 = iVar33 + 1;
        } while (bVar36);
      }
      lVar24 = 0;
      do {
        auVar8._4_4_ = fVar39;
        auVar8._0_4_ = fVar39;
        auVar8._8_4_ = fVar39;
        auVar8._12_4_ = fVar39;
        auVar37 = divps(*(undefined1 (*) [16])(local_d8 + lVar24 * 4),auVar8);
        *(undefined1 (*) [16])(local_d8 + lVar24 * 4) = auVar37;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 0x20);
    }
    else {
      if (iVar32 < 3) {
        fVar39 = 0.1;
      }
      else {
        fVar39 = 0.1;
        lVar24 = lVar24 * 2;
        iVar33 = 1;
        do {
          lVar2 = lVar24 + lVar14 * 2;
          if (2 < iVar31) {
            lVar26 = lVar14 * 2 + lVar2;
            uVar23 = 1;
            do {
              puVar1 = (ushort *)(lVar24 + lVar14 * 2 + -2 + uVar23 * 2);
              puVar18 = (ushort *)(uVar23 * 2 + 2 + lVar2);
              iVar15 = (uint)puVar18[lVar14] + (uint)puVar18[-lVar14] + (uint)*puVar18 * 2;
              iVar34 = (uint)puVar1[lVar14] + (uint)puVar1[-lVar14] + (uint)*puVar1 * 2;
              iVar27 = (uint)*(ushort *)(lVar26 + 2 + uVar23 * 2) +
                       (uint)*(ushort *)(lVar26 + -2 + uVar23 * 2) +
                       (uint)*(ushort *)(lVar26 + uVar23 * 2) * 2;
              iVar12 = (uint)*(ushort *)(lVar24 + 2 + uVar23 * 2) +
                       (uint)*(ushort *)(lVar24 + -2 + uVar23 * 2) +
                       (uint)*(ushort *)(lVar24 + uVar23 * 2) * 2;
              iVar19 = iVar15 - iVar34;
              if ((iVar19 != 0) || (iVar27 != iVar12)) {
                iVar27 = iVar27 - iVar12;
                iVar12 = -iVar19;
                if (0 < iVar19) {
                  iVar12 = iVar19;
                }
                iVar29 = -iVar27;
                if (0 < iVar27) {
                  iVar29 = iVar27;
                }
                uVar28 = iVar29 + iVar12;
                if (uVar28 != 0) {
                  if (iVar15 == iVar34) {
                    local_d8 = (undefined1  [4])((float)local_d8 + (float)(uVar28 >> 1));
                    pfVar13 = (float *)(local_68 + 0xc);
                    fVar38 = (float)(uVar28 >> 1);
                  }
                  else {
                    iVar19 = (iVar27 * 0x10000) / iVar19;
                    if (iVar19 < -0x11a6e) {
                      uVar16 = 7;
                      uVar20 = 0;
                    }
                    else if (iVar19 < -0xc79) {
                      uVar16 = 0xf;
                      uVar20 = 8;
                    }
                    else {
                      uVar20 = (uint)(0xe821 < iVar19) * 8 + 0x10;
                      uVar16 = (uint)(0xe821 < iVar19) * 8 + 0x17;
                    }
                    lVar25 = 0x7c;
                    if (uVar20 <= uVar16) {
                      uVar21 = (ulong)uVar20;
                      piVar35 = &get_hist_bin_idx_thresholds + uVar21;
                      do {
                        if (iVar19 <= *piVar35) goto LAB_0024c5e6;
                        uVar21 = uVar21 + 1;
                        piVar35 = piVar35 + 1;
                      } while (uVar16 + 1 != uVar21);
                      uVar21 = 0x1f;
LAB_0024c5e6:
                      lVar25 = (long)(int)uVar21 << 2;
                    }
                    pfVar13 = (float *)(local_d8 + lVar25);
                    fVar38 = (float)(int)uVar28;
                  }
                  fVar39 = fVar39 + (float)(int)uVar28;
                  *pfVar13 = fVar38 + *pfVar13;
                }
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != iVar31 - 1);
          }
          bVar36 = iVar33 != iVar32 + -2;
          lVar24 = lVar2;
          iVar33 = iVar33 + 1;
        } while (bVar36);
      }
      lVar24 = 0;
      do {
        auVar37._4_4_ = fVar39;
        auVar37._0_4_ = fVar39;
        auVar37._8_4_ = fVar39;
        auVar37._12_4_ = fVar39;
        auVar37 = divps(*(undefined1 (*) [16])(local_d8 + lVar24 * 4),auVar37);
        *(undefined1 (*) [16])(local_d8 + lVar24 * 4) = auVar37;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 0x20);
    }
  }
  fVar39 = (float)((iVar5 + 1) * (iVar6 + 1));
  lVar24 = 0;
  do {
    lVar14 = lVar24 * 4;
    fVar38 = *(float *)(local_d8 + lVar14 + 4);
    fVar10 = *(float *)(local_d8 + lVar14 + 8);
    fVar11 = *(float *)(local_c8 + lVar14 + -4);
    lVar2 = lVar24 * 4;
    *(float *)(local_d8 + lVar2) = *(float *)(local_d8 + lVar14) * fVar39;
    *(float *)(local_d8 + lVar2 + 4) = fVar38 * fVar39;
    *(float *)(local_d8 + lVar2 + 8) = fVar10 * fVar39;
    *(float *)(local_c8 + lVar2 + -4) = fVar11 * fVar39;
    lVar24 = lVar24 + 4;
  } while (lVar24 != 0x20);
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  (*av1_nn_predict)((float *)local_d8,&av1_intra_hog_model_nnconfig,1,local_58);
  lVar24 = 0;
  do {
    fVar39 = local_58[lVar24 + 1];
    fVar38 = local_58[lVar24 + 2];
    fVar10 = local_58[lVar24 + 3];
    if (local_58[lVar24] <= th) {
      directional_mode_skip_mask[lVar24 + 1] = '\x01';
    }
    if (fVar39 <= th) {
      directional_mode_skip_mask[lVar24 + 2] = '\x01';
    }
    if (fVar38 <= th) {
      directional_mode_skip_mask[lVar24 + 3] = '\x01';
    }
    if (fVar10 <= th) {
      directional_mode_skip_mask[lVar24 + 4] = '\x01';
    }
    lVar24 = lVar24 + 4;
  } while (lVar24 != 8);
  return;
}

Assistant:

static inline void prune_intra_mode_with_hog(
    const MACROBLOCK *x, BLOCK_SIZE bsize, BLOCK_SIZE sb_size, float th,
    uint8_t *directional_mode_skip_mask, int is_chroma) {
  const int plane = is_chroma ? AOM_PLANE_U : AOM_PLANE_Y;
  float hist[BINS] = { 0.0f };
  collect_hog_data(x, bsize, sb_size, plane, hist);

  // Make prediction for each of the mode
  float scores[DIRECTIONAL_MODES] = { 0.0f };
  av1_nn_predict(hist, &av1_intra_hog_model_nnconfig, 1, scores);
  for (UV_PREDICTION_MODE uv_mode = UV_V_PRED; uv_mode <= UV_D67_PRED;
       uv_mode++) {
    if (scores[uv_mode - UV_V_PRED] <= th) {
      directional_mode_skip_mask[uv_mode] = 1;
    }
  }
}